

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_object.cpp
# Opt level: O0

value * mjs::anon_unknown_33::get_property_names
                  (value *__return_storage_ptr__,gc_heap_ptr<mjs::global_object> *global,value *o,
                  bool check_enumerable)

{
  pointer *this;
  gc_heap *h_00;
  global_object *pgVar1;
  object_ptr *this_00;
  object *poVar2;
  size_type sVar3;
  const_reference s;
  uint32_t index;
  wstring_view wVar4;
  value local_f0;
  wstring local_c8;
  wstring_view local_a8;
  string local_98;
  uint local_84;
  gc_heap *pgStack_80;
  uint32_t i;
  gc_heap *h;
  undefined1 local_68 [8];
  object_ptr a;
  undefined1 local_50 [4];
  uint32_t ns;
  vector<mjs::string,_std::allocator<mjs::string>_> n;
  bool check_enumerable_local;
  value *o_local;
  gc_heap_ptr<mjs::global_object> *global_local;
  
  pgVar1 = gc_heap_ptr<mjs::global_object>::operator->(global);
  this = &n.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage;
  global_object::validate_object((global_object *)this,(value *)pgVar1);
  gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)this);
  this_00 = value::object_value(o);
  poVar2 = gc_heap_ptr<mjs::object>::operator->(this_00);
  object::own_property_names
            ((vector<mjs::string,_std::allocator<mjs::string>_> *)local_50,poVar2,check_enumerable);
  sVar3 = std::vector<mjs::string,_std::allocator<mjs::string>_>::size
                    ((vector<mjs::string,_std::allocator<mjs::string>_> *)local_50);
  a.super_gc_heap_ptr_untyped._12_4_ = SUB84(sVar3,0);
  make_array((mjs *)local_68,global,a.super_gc_heap_ptr_untyped._12_4_);
  pgVar1 = gc_heap_ptr<mjs::global_object>::operator->(global);
  pgStack_80 = object::heap(&pgVar1->super_object);
  for (local_84 = 0; local_84 < (uint)a.super_gc_heap_ptr_untyped._12_4_; local_84 = local_84 + 1) {
    poVar2 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_68);
    h_00 = pgStack_80;
    index_string_abi_cxx11_(&local_c8,(mjs *)(ulong)local_84,index);
    wVar4 = (wstring_view)
            std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)&local_c8);
    local_a8 = wVar4;
    string::string(&local_98,h_00,&local_a8);
    s = std::vector<mjs::string,_std::allocator<mjs::string>_>::operator[]
                  ((vector<mjs::string,_std::allocator<mjs::string>_> *)local_50,(ulong)local_84);
    value::value(&local_f0,s);
    (*poVar2->_vptr_object[1])(poVar2,&local_98,&local_f0,0);
    value::~value(&local_f0);
    string::~string(&local_98);
    std::__cxx11::wstring::~wstring((wstring *)&local_c8);
  }
  value::value(__return_storage_ptr__,(object_ptr *)local_68);
  gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)local_68);
  std::vector<mjs::string,_std::allocator<mjs::string>_>::~vector
            ((vector<mjs::string,_std::allocator<mjs::string>_> *)local_50);
  return __return_storage_ptr__;
}

Assistant:

value get_property_names(const gc_heap_ptr<global_object>& global, const value& o, bool check_enumerable) {
    global->validate_object(o);
    const auto n = o.object_value()->own_property_names(check_enumerable);
    const auto ns = static_cast<uint32_t>(n.size());
    auto a = make_array(global, ns);
    auto& h = global->heap();
    for (uint32_t i = 0; i < ns; ++i) {
        a->put(string{h,index_string(i)}, value{n[i]});
    }
    return value{a};
}